

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O3

bool __thiscall
glslang::TSymbolValidater::typeCheck
          (TSymbolValidater *this,TType *type1,TType *type2,string *name,bool isBlock)

{
  TType *pTVar1;
  TType *pTVar2;
  pointer pcVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__str;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  string errorStr;
  string newName;
  bool local_a8;
  long *local_78 [2];
  long local_68 [2];
  char *local_58;
  string local_50;
  
  iVar6 = (*type1->_vptr_TType[0x25])(type1);
  if (((char)iVar6 == '\0') || (iVar6 = (*type2->_vptr_TType[0x25])(type2), (char)iVar6 == '\0')) {
    bVar5 = qualifierCheck(this,type1,type2,name,isBlock);
    return bVar5;
  }
  iVar6 = (*type1->_vptr_TType[7])(type1);
  if (iVar6 == 0x10) {
    iVar6 = (*type2->_vptr_TType[7])(type2);
    isBlock = iVar6 == 0x10 || isBlock;
  }
  iVar6 = (*type1->_vptr_TType[0x25])(type1);
  if ((char)iVar6 != '\0') {
    pTVar1 = (type1->field_13).referentType;
    iVar6 = (*type2->_vptr_TType[0x25])(type2);
    if ((char)iVar6 != '\0') {
      pTVar2 = (type2->field_13).referentType;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar3 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + name->_M_string_length);
      lVar9 = (long)(pTVar1->qualifier).semanticName - *(long *)&pTVar1->field_0x8;
      if (lVar9 == 0) {
        local_a8 = false;
        uVar14 = 0;
      }
      else {
        lVar9 = lVar9 >> 5;
        uVar12 = 0;
        uVar14 = 0;
        local_a8 = false;
        do {
          uVar11 = uVar12;
          if ((ulong)((long)(pTVar1->qualifier).semanticName - *(long *)&pTVar1->field_0x8 >> 5) <=
              uVar12) goto LAB_0047e36a;
          lVar13 = uVar12 * 0x20;
          iVar6 = (**(code **)(**(long **)(*(long *)&pTVar1->field_0x8 + lVar13) + 0x38))();
          if (iVar6 != 0) {
            lVar7 = *(long *)&pTVar2->field_0x8;
            uVar8 = (long)(pTVar2->qualifier).semanticName - lVar7 >> 5;
            if (uVar14 < uVar8) {
              lVar10 = uVar14 << 5;
              do {
                iVar6 = (**(code **)(**(long **)(lVar7 + lVar10) + 0x38))();
                lVar7 = *(long *)&pTVar2->field_0x8;
                pcVar4 = (pTVar2->qualifier).semanticName;
                if (iVar6 != 0) {
                  uVar8 = (long)pcVar4 - lVar7 >> 5;
                  break;
                }
                uVar14 = uVar14 + 1;
                uVar8 = (long)pcVar4 - lVar7 >> 5;
                lVar10 = lVar10 + 0x20;
              } while (uVar14 < uVar8);
            }
            if (uVar14 == uVar8) {
              pcVar3 = (name->_M_dataplus)._M_p;
              local_78[0] = local_68;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_78,pcVar3,pcVar3 + name->_M_string_length);
              std::__cxx11::string::append((char *)local_78);
              TInfoSinkBase::message(&this->infoSink->info,EPrefixError,(char *)local_78[0]);
              if (local_78[0] != local_68) {
                operator_delete(local_78[0],local_68[0] + 1);
              }
              local_a8 = true;
              break;
            }
            if ((ulong)((long)(pTVar1->qualifier).semanticName - *(long *)&pTVar1->field_0x8 >> 5)
                <= uVar12) {
LAB_0047e36a:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar11);
            }
            this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (**(code **)(**(long **)(*(long *)&pTVar1->field_0x8 + lVar13) + 0x30))();
            uVar11 = uVar14;
            if ((ulong)((long)(pTVar2->qualifier).semanticName - *(long *)&pTVar2->field_0x8 >> 5)
                <= uVar14) goto LAB_0047e36a;
            __str = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    (**(code **)(**(long **)(*(long *)&pTVar2->field_0x8 + uVar14 * 0x20) + 0x30))()
            ;
            iVar6 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(this_00,__str);
            if (iVar6 == 0) {
              uVar11 = uVar12;
              if ((ulong)((long)(pTVar1->qualifier).semanticName - *(long *)&pTVar1->field_0x8 >> 5)
                  <= uVar12) goto LAB_0047e36a;
              lVar7 = (**(code **)(**(long **)(*(long *)&pTVar1->field_0x8 + lVar13) + 0x30))();
              pcVar4 = *(char **)(lVar7 + 8);
              local_58 = (char *)local_50._M_string_length;
              strlen(pcVar4);
              std::__cxx11::string::_M_replace((ulong)&local_50,0,local_58,(ulong)pcVar4);
              if (local_a8 == false) {
                if (((ulong)((long)(pTVar1->qualifier).semanticName - *(long *)&pTVar1->field_0x8 >>
                            5) <= uVar12) ||
                   (uVar11 = uVar14,
                   (ulong)((long)(pTVar2->qualifier).semanticName - *(long *)&pTVar2->field_0x8 >> 5
                          ) <= uVar14)) goto LAB_0047e36a;
                local_a8 = typeCheck(this,*(TType **)(*(long *)&pTVar1->field_0x8 + lVar13),
                                     *(TType **)(*(long *)&pTVar2->field_0x8 + uVar14 * 0x20),
                                     &local_50,isBlock);
              }
              else {
                local_a8 = true;
              }
            }
            else {
              pcVar3 = (name->_M_dataplus)._M_p;
              local_78[0] = local_68;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_78,pcVar3,pcVar3 + name->_M_string_length);
              std::__cxx11::string::append((char *)local_78);
              TInfoSinkBase::message(&this->infoSink->info,EPrefixError,(char *)local_78[0]);
              if (local_78[0] != local_68) {
                operator_delete(local_78[0],local_68[0] + 1);
              }
              local_a8 = true;
            }
          }
          uVar12 = uVar12 + 1;
          uVar14 = uVar14 + 1;
        } while (uVar12 != lVar9 + (ulong)(lVar9 == 0));
      }
      lVar9 = *(long *)&pTVar2->field_0x8;
      if (uVar14 < (ulong)((long)(pTVar2->qualifier).semanticName - lVar9 >> 5)) {
        lVar13 = uVar14 << 5;
        do {
          iVar6 = (**(code **)(**(long **)(lVar9 + lVar13) + 0x38))();
          if (iVar6 != 0) {
            pcVar3 = (name->_M_dataplus)._M_p;
            local_78[0] = local_68;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_78,pcVar3,pcVar3 + name->_M_string_length);
            std::__cxx11::string::append((char *)local_78);
            TInfoSinkBase::message(&this->infoSink->info,EPrefixError,(char *)local_78[0]);
            if (local_78[0] != local_68) {
              operator_delete(local_78[0],local_68[0] + 1);
            }
            local_a8 = true;
            break;
          }
          uVar14 = uVar14 + 1;
          lVar9 = *(long *)&pTVar2->field_0x8;
          lVar13 = lVar13 + 0x20;
        } while (uVar14 < (ulong)((long)(pTVar2->qualifier).semanticName - lVar9 >> 5));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      return local_a8;
    }
  }
  __assert_fail("isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
}

Assistant:

bool typeCheck(const TType* const type1, const TType* const type2, const std::string& name, bool isBlock)
    {
        bool hasError = false;
        if (!(type1->isStruct() && type2->isStruct())) {
            hasError = hasError || qualifierCheck(type1, type2, name, isBlock);
        }
        else {
            if (type1->getBasicType() == EbtBlock && type2->getBasicType() == EbtBlock)
                isBlock = true;
            const TTypeList* typeList1 = type1->getStruct();
            const TTypeList* typeList2 = type2->getStruct();

            std::string newName = name;
            size_t memberCount = typeList1->size();
            size_t index2 = 0;
            for (size_t index = 0; index < memberCount; index++, index2++) {
                // Skip inactive member
                if (typeList1->at(index).type->getBasicType() == EbtVoid)
                    continue;
                while (index2 < typeList2->size() && typeList2->at(index2).type->getBasicType() == EbtVoid) {
                    ++index2;
                }

                // TypeList1 has more members in list
                if (index2 == typeList2->size()) {
                    std::string errorStr = name + ": struct mismatch.";
                    infoSink.info.message(EPrefixError, errorStr.c_str());
                    hasError = true;
                    break;
                }

                if (typeList1->at(index).type->getFieldName() != typeList2->at(index2).type->getFieldName()) {
                    std::string errorStr = name + ": member name mismatch.";
                    infoSink.info.message(EPrefixError, errorStr.c_str());
                    hasError = true;
                }
                else {
                    newName = typeList1->at(index).type->getFieldName().c_str();
                }
                hasError = hasError || typeCheck(typeList1->at(index).type, typeList2->at(index2).type, newName, isBlock);
            }

            while (index2 < typeList2->size())
            {
                // TypeList2 has more members
                if (typeList2->at(index2).type->getBasicType() != EbtVoid) {
                    std::string errorStr = name + ": struct mismatch.";
                    infoSink.info.message(EPrefixError, errorStr.c_str());
                    hasError = true;
                    break;
                }
                ++index2;
            }
        }
        return hasError;
    }